

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak_internal.hpp
# Opt level: O1

bool __thiscall
adiak::internal::create_container_type<std::vector<int,_std::allocator<int>_>_>::make_value
          (create_container_type<std::vector<int,_std::allocator<int>_>_> *this,
          vector<int,_std::allocator<int>_> *c,adiak_value_t *value,adiak_datatype_t *dtype)

{
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  iterator i;
  int *piVar4;
  
  piVar4 = *(int **)this;
  piVar1 = *(int **)(this + 8);
  piVar2 = (pointer)malloc(((long)piVar1 - (long)piVar4) * 2);
  piVar3 = piVar2;
  for (; piVar1 != piVar4; piVar4 = piVar4 + 1) {
    *piVar3 = *piVar4;
    piVar3 = piVar3 + 2;
  }
  (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       piVar2;
  value[1].v_int = (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 2);
  return piVar1 == piVar4;
}

Assistant:

static bool make_value(T &c, adiak_value_t *value, adiak_datatype_t *dtype) {
            adiak_value_t *valarray = (adiak_value_t *) malloc(sizeof(adiak_value_t) * c.size());
            int j = 0;
            for (typename T::iterator i = c.begin(); i != c.end(); i++) {
               bool result = parse<typename T::value_type>::make_value(*i, valarray + j++, dtype->subtype[0]);               
               if (!result)
                  return false;
            }
            element_type<T>::set(*value, valarray);
            dtype->num_elements = c.size();
            return true;
         }